

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::
BasicTypeInfo<dap::optional<std::vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>_>_>
::~BasicTypeInfo(BasicTypeInfo<dap::optional<std::vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>_>_>
                 *this)

{
  ~BasicTypeInfo(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}